

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O0

void __thiscall HEkkDual::minorUpdate(HEkkDual *this)

{
  double *pdVar1;
  reference pvVar2;
  reference pvVar3;
  HEkkDual *in_RDI;
  double dVar4;
  double myWeight;
  double myInfeas;
  HighsInt iRow;
  HighsInt i_1;
  HighsInt countRemain;
  HighsInt i;
  MFinish *finish;
  HEkkDual *in_stack_00000050;
  HEkkDual *in_stack_000000c0;
  HEkkDual *in_stack_ffffffffffffffc0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  int local_1c;
  int local_18;
  int local_14;
  HEkkDual *this_00;
  
  this_00 = (HEkkDual *)(in_RDI->multi_finish + in_RDI->multi_nFinish);
  pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                     (&(in_RDI->ekk_instance_->basis_).nonbasicMove_,(long)in_RDI->variable_in);
  *(value_type *)&this_00->algorithm = *pvVar2;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&(in_RDI->ekk_instance_->info_).workShift_,(long)in_RDI->variable_out);
  *(value_type *)&this_00->new_devex_framework = *pvVar3;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x7903d3);
  for (local_14 = 0; local_14 < (in_RDI->dualRow).workCount; local_14 = local_14 + 1) {
    in_stack_ffffffffffffffc0 = (HEkkDual *)&this_00->ekk_instance_;
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
              (&(in_RDI->dualRow).workData,(long)local_14);
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffd0,(value_type_conflict2 *)in_RDI);
  }
  minorUpdateDual(this_00);
  minorUpdatePrimal(in_stack_00000050);
  minorUpdatePivots(in_stack_ffffffffffffffc0);
  minorUpdateRows(in_stack_000000c0);
  if ((in_RDI->minor_new_devex_framework & 1U) != 0) {
    minorInitialiseDevexFramework(in_RDI);
  }
  in_RDI->multi_nFinish = in_RDI->multi_nFinish + 1;
  iterationAnalysisMinor(in_stack_ffffffffffffffc0);
  local_18 = 0;
  for (local_1c = 0; local_1c < in_RDI->multi_num; local_1c = local_1c + 1) {
    if (-1 < in_RDI->multi_choice[local_1c].row_out) {
      dVar4 = in_RDI->multi_choice[local_1c].infeasValue / in_RDI->multi_choice[local_1c].infeasEdWt
      ;
      pdVar1 = &in_RDI->multi_choice[local_1c].infeasLimit;
      local_18 = (uint)(*pdVar1 <= dVar4 && dVar4 != *pdVar1) + local_18;
    }
  }
  if (local_18 == 0) {
    in_RDI->multi_chooseAgain = 1;
  }
  return;
}

Assistant:

void HEkkDual::minorUpdate() {
  // Minor update - store roll back data
  MFinish* finish = &multi_finish[multi_nFinish];
  finish->move_in = ekk_instance_.basis_.nonbasicMove_[variable_in];
  finish->shiftOut = ekk_instance_.info_.workShift_[variable_out];
  finish->flipList.clear();
  for (HighsInt i = 0; i < dualRow.workCount; i++)
    finish->flipList.push_back(dualRow.workData[i].first);

  // Minor update - key parts
  minorUpdateDual();
  minorUpdatePrimal();
  minorUpdatePivots();
  minorUpdateRows();
  if (minor_new_devex_framework) {
    /*
    printf("Iter %7" HIGHSINT_FORMAT " (Major %7" HIGHSINT_FORMAT "): Minor new
    Devex framework\n", ekk_instance_.iteration_count_,
           multi_iteration);
    */
    minorInitialiseDevexFramework();
  }
  multi_nFinish++;
  // Analyse the iteration: possibly report; possibly switch strategy
  iterationAnalysisMinor();

  // Minor update - check for the next iteration
  HighsInt countRemain = 0;
  for (HighsInt i = 0; i < multi_num; i++) {
    HighsInt iRow = multi_choice[i].row_out;
    if (iRow < 0) continue;
    double myInfeas = multi_choice[i].infeasValue;
    double myWeight = multi_choice[i].infeasEdWt;
    countRemain += (myInfeas / myWeight > multi_choice[i].infeasLimit);
  }
  if (countRemain == 0) multi_chooseAgain = 1;
}